

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O1

CURLcode smtp_do(Curl_easy *data,_Bool *done)

{
  curl_mimepart *part;
  uint *puVar1;
  SMTP *pSVar2;
  curl_trc_feat *pcVar3;
  _Bool _Var4;
  CURLcode CVar5;
  CURLcode CVar6;
  char *pcVar7;
  char *pcVar8;
  curl_off_t cVar9;
  char *pcVar10;
  ulong uVar11;
  curl_slist *pcVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  bool bVar18;
  connectdata *pcVar19;
  char *address;
  connectdata *local_68;
  CURLcode local_5c;
  hostname host;
  
  *done = false;
  pcVar7 = (data->set).str[0x1c];
  if (pcVar7 == (char *)0x0) {
    CVar5 = CURLE_OK;
  }
  else {
    CVar5 = Curl_urldecode(pcVar7,0,&((data->req).p.file)->freepath,(size_t *)0x0,REJECT_CTRL);
  }
  if (CVar5 != CURLE_OK) {
    return CVar5;
  }
  (data->req).size = -1;
  Curl_pgrsSetUploadCounter(data,0);
  Curl_pgrsSetDownloadCounter(data,0);
  Curl_pgrsSetUploadSize(data,-1);
  Curl_pgrsSetDownloadSize(data,-1);
  pSVar2 = (data->req).p.smtp;
  if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
      ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level)))) &&
     (0 < Curl_trc_feat_smtp.log_level)) {
    Curl_trc_smtp(data,"smtp_perform(), start");
  }
  if (((data->req).field_0xd3 & 2) != 0) {
    pSVar2->transfer = PPTRANSFER_INFO;
  }
  *done = false;
  pSVar2->rcpt = (data->set).mail_rcpt;
  pSVar2->rcpt_last_error = 0;
  pSVar2->field_0x28 = pSVar2->field_0x28 & 0xfc | 2;
  pSVar2->eob = 2;
  if (((((data->state).field_0x7c0 & 8) == 0) && ((data->set).mimepost.kind == MIMEKIND_NONE)) ||
     ((data->set).mail_rcpt == (curl_slist *)0x0)) {
    CVar5 = smtp_perform_command(data);
    goto LAB_00159625;
  }
  pcVar19 = data->conn;
  pcVar7 = (data->set).str[0x36];
  if (pcVar7 == (char *)0x0) {
    pcVar7 = (*Curl_cstrdup)("<>");
    bVar18 = false;
LAB_00159305:
    CVar5 = CURLE_OUT_OF_MEMORY;
    if (pcVar7 == (char *)0x0) {
      pcVar10 = (char *)0x0;
      pcVar8 = (char *)0x0;
      pcVar7 = (char *)0x0;
    }
    else {
      pcVar8 = (data->set).str[0x37];
      if ((pcVar8 == (char *)0x0) || (*(short *)((long)&pcVar19->proto + 0xbc) == 0)) {
        pcVar10 = (char *)0x0;
      }
      else {
        if (*pcVar8 == '\0') {
          pcVar10 = (*Curl_cstrdup)("<>");
        }
        else {
          address = (char *)0x0;
          host.name = (char *)0x0;
          host.dispname = (char *)0x0;
          host.rawalloc = (char *)0x0;
          host.encalloc = (char *)0x0;
          CVar6 = smtp_parse_address(pcVar8,&address,&host);
          if (CVar6 == CURLE_OK) {
            local_5c = CVar6;
            if (((!bVar18) && ((*(byte *)((long)&pcVar19->proto + 0xd0) & 8) != 0)) &&
               ((host.encalloc != (char *)0x0 ||
                ((_Var4 = Curl_is_ASCII_name(address), !_Var4 ||
                 (_Var4 = Curl_is_ASCII_name(host.name), !_Var4)))))) {
              bVar18 = true;
            }
            if (host.name == (char *)0x0) {
              pcVar10 = curl_maprintf("<%s>",address);
            }
            else {
              pcVar10 = curl_maprintf("<%s@%s>",address);
            }
            (*Curl_cfree)(address);
            CVar6 = local_5c;
          }
          else {
            pcVar10 = (char *)0x0;
          }
          if (CVar6 != CURLE_OK) {
            pcVar8 = (char *)0x0;
            CVar5 = CVar6;
            goto LAB_001595f8;
          }
        }
        if (pcVar10 == (char *)0x0) goto LAB_001592fa;
      }
      local_68 = pcVar19;
      if ((data->set).mimepost.kind == MIMEKIND_NONE) {
        CVar6 = Curl_creader_set_fread(data,(data->state).infilesize);
        if (CVar6 != CURLE_OK) goto LAB_00159434;
      }
      else {
        part = &(data->set).mimepost;
        puVar1 = &(data->set).mimepost.flags;
        *(byte *)puVar1 = (byte)*puVar1 & 0xfd;
        curl_mime_headers(part,(data->set).headers,0);
        CVar6 = Curl_mime_prepare_headers(data,part,(char *)0x0,(char *)0x0,MIMESTRATEGY_MAIL);
        if (CVar6 == CURLE_OK) {
          pcVar8 = Curl_checkheaders(data,"Mime-Version",0xc);
          CVar6 = CURLE_OK;
          if (pcVar8 == (char *)0x0) {
            CVar6 = Curl_mime_add_header(&(data->set).mimepost.curlheaders,"Mime-Version: 1.0");
          }
        }
        if (CVar6 == CURLE_OK) {
          CVar6 = Curl_creader_set_mime(data,part);
        }
        if (CVar6 != CURLE_OK) {
LAB_00159434:
          CVar5 = CVar6;
          pcVar8 = (char *)0x0;
          goto LAB_001595f8;
        }
        cVar9 = Curl_creader_total_length(data);
        (data->state).infilesize = cVar9;
        pcVar19 = local_68;
      }
      if (((*(byte *)((long)&pcVar19->proto + 0xd0) & 4) == 0) || ((data->state).infilesize < 1)) {
        pcVar8 = (char *)0x0;
      }
      else {
        pcVar8 = curl_maprintf("%ld");
        if (pcVar8 == (char *)0x0) {
          pcVar8 = (char *)0x0;
          goto LAB_001595f8;
        }
      }
      if ((((*(byte *)((long)&local_68->proto + 0xd0) & 8) != 0) && (!bVar18)) &&
         (pcVar12 = ((data->req).p.smtp)->rcpt, pcVar12 != (curl_slist *)0x0)) {
        do {
          _Var4 = Curl_is_ASCII_name(pcVar12->data);
          if (!_Var4) {
            bVar18 = true;
          }
          pcVar12 = pcVar12->next;
        } while ((pcVar12 != (curl_slist *)0x0) && (!bVar18));
      }
      host.rawalloc = (char *)0x0;
      CVar5 = Curl_creader_create((Curl_creader **)&host,data,&cr_eob,CURL_CR_CONTENT_ENCODE);
      if (CVar5 == CURLE_OK) {
        CVar5 = Curl_creader_add(data,(Curl_creader *)host.rawalloc);
      }
      if (host.rawalloc != (char *)0x0 && CVar5 != CURLE_OK) {
        Curl_creader_free(data,(Curl_creader *)host.rawalloc);
      }
      if (CVar5 == CURLE_OK) {
        pcVar14 = " AUTH=";
        pcVar15 = pcVar10;
        if (pcVar10 == (char *)0x0) {
          pcVar14 = "";
          pcVar15 = "";
        }
        pcVar16 = " SIZE=";
        pcVar17 = pcVar8;
        if (pcVar8 == (char *)0x0) {
          pcVar16 = "";
          pcVar17 = "";
        }
        pcVar13 = " SMTPUTF8";
        if (!bVar18) {
          pcVar13 = "";
        }
        CVar5 = Curl_pp_sendf(data,&(local_68->proto).ftpc.pp,"MAIL FROM:%s%s%s%s%s%s",pcVar7,
                              pcVar14,pcVar15,pcVar16,pcVar17,pcVar13);
      }
    }
  }
  else {
    address = (char *)0x0;
    host.name = (char *)0x0;
    host.dispname = (char *)0x0;
    host.rawalloc = (char *)0x0;
    host.encalloc = (char *)0x0;
    CVar5 = smtp_parse_address(pcVar7,&address,&host);
    if (CVar5 == CURLE_OK) {
      if ((*(byte *)((long)&pcVar19->proto + 0xd0) & 8) == 0) {
        bVar18 = false;
      }
      else {
        bVar18 = true;
        if (host.encalloc == (char *)0x0) {
          _Var4 = Curl_is_ASCII_name(address);
          bVar18 = true;
          if (_Var4) {
            _Var4 = Curl_is_ASCII_name(host.name);
            bVar18 = !_Var4;
          }
        }
      }
      if (host.name == (char *)0x0) {
        pcVar7 = curl_maprintf("<%s>",address);
      }
      else {
        pcVar7 = curl_maprintf("<%s@%s>",address);
      }
      (*Curl_cfree)(address);
    }
    else {
      pcVar7 = (char *)0x0;
      bVar18 = false;
    }
    if (CVar5 == CURLE_OK) goto LAB_00159305;
LAB_001592fa:
    pcVar10 = (char *)0x0;
    pcVar8 = (char *)0x0;
  }
LAB_001595f8:
  (*Curl_cfree)(pcVar7);
  (*Curl_cfree)(pcVar10);
  (*Curl_cfree)(pcVar8);
  if (CVar5 == CURLE_OK) {
    smtp_state(data,SMTP_MAIL);
  }
LAB_00159625:
  uVar11 = 0;
  if (CVar5 == CURLE_OK) {
    pcVar19 = data->conn;
    CVar5 = Curl_pp_statemach(data,&(pcVar19->proto).ftpc.pp,false,false);
    *done = (pcVar19->proto).smtpc.state == SMTP_STOP;
    _Var4 = Curl_conn_is_connected(data->conn,0);
    uVar11 = (ulong)_Var4;
  }
  if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
      ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level)))) &&
     (0 < Curl_trc_feat_smtp.log_level)) {
    Curl_trc_smtp(data,"smtp_perform() -> %d, connected=%d, done=%d",(ulong)CVar5,uVar11,
                  (ulong)*done);
  }
  if (CVar5 == CURLE_OK) {
    CVar5 = CURLE_OK;
    if ((*done == true) && (((data->req).p.imap)->transfer != PPTRANSFER_BODY)) {
      Curl_xfer_setup_nop(data);
      CVar5 = CURLE_OK;
    }
  }
  if (data != (Curl_easy *)0x0) {
    if ((((data->set).field_0x89f & 0x40) != 0) &&
       (((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level)) &&
        (0 < Curl_trc_feat_smtp.log_level)))) {
      Curl_trc_smtp(data,"smtp_regular_transfer() -> %d, done=%d",(ulong)CVar5,(ulong)*done);
    }
    if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
        ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level))))
       && (0 < Curl_trc_feat_smtp.log_level)) {
      Curl_trc_smtp(data,"smtp_do() -> %d, done=%d",(ulong)CVar5,(ulong)*done);
    }
  }
  return CVar5;
}

Assistant:

static CURLcode smtp_do(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  DEBUGASSERT(data);
  DEBUGASSERT(data->conn);
  *done = FALSE; /* default to false */

  /* Parse the custom request */
  result = smtp_parse_custom_request(data);
  if(result)
    return result;

  result = smtp_regular_transfer(data, done);
  CURL_TRC_SMTP(data, "smtp_do() -> %d, done=%d", result, *done);
  return result;
}